

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode JsCloneObject(JsValueRef source,JsValueRef *newObject)

{
  bool bVar1;
  JsErrorCode exitStatus;
  int iVar2;
  JsrtContext *currentContext;
  JavascriptProxy *this;
  DynamicObject *pDVar3;
  undefined4 extraout_var;
  TTDJsRTActionResultAutoRecorder local_58;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (source == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  local_58.m_actionEvent = (EventLogEntry *)0x0;
  local_58.m_resultPtr = (TTDVar *)0x0;
  currentContext = JsrtContext::GetCurrent();
  exitStatus = CheckContext(currentContext,false,false);
  if (exitStatus != JsNoError) goto LAB_003b4bf0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  while (bVar1 = Js::VarIs<Js::JavascriptProxy>(source), bVar1) {
    this = Js::UnsafeVarTo<Js::JavascriptProxy>(source);
    source = Js::JavascriptProxy::GetTarget(this);
  }
  bVar1 = Js::DynamicObject::IsBaseDynamicObject(source);
  if ((bVar1) || (bVar1 = Js::VarIs<JsrtExternalObject>(source), bVar1)) {
LAB_003b4bca:
    pDVar3 = Js::UnsafeVarTo<Js::DynamicObject>(source);
    iVar2 = (*(pDVar3->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x69])(pDVar3,1);
    *newObject = (JsValueRef)CONCAT44(extraout_var,iVar2);
    exitStatus = JsNoError;
  }
  else {
    bVar1 = Js::VarIs<Js::CustomExternalWrapperObject>(source);
    exitStatus = JsErrorInvalidArgument;
    if (bVar1) goto LAB_003b4bca;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
LAB_003b4bf0:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode(&local_58,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsCloneObject(_In_ JsValueRef source, _Out_ JsValueRef* newObject)
{
    VALIDATE_JSREF(source);

    return ContextAPINoScriptWrapper([&](Js::ScriptContext* scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {

        while (Js::VarIs<Js::JavascriptProxy>(source))
        {
            source = Js::UnsafeVarTo<Js::JavascriptProxy>(source)->GetTarget();
        }

        // We can currently only clone certain types of dynamic objects
        // TODO: support other object types
        if (Js::DynamicObject::IsBaseDynamicObject(source) ||
            Js::VarIs<JsrtExternalObject>(source) ||
            Js::VarIs<Js::CustomExternalWrapperObject>(source))
        {
            Js::DynamicObject* objSource = Js::UnsafeVarTo<Js::DynamicObject>(source);
            *newObject = objSource->Copy(true);
            return JsNoError;
        }

        return JsErrorInvalidArgument;
    });
}